

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  byte bVar39;
  byte bVar40;
  int iVar41;
  AABBNodeMB4D *node1;
  ulong uVar42;
  ulong uVar43;
  ushort uVar44;
  byte bVar45;
  QuadMesh *mesh;
  uint uVar46;
  NodeRef root;
  byte bVar47;
  uint uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  vuint<4> *v;
  long lVar52;
  NodeRef *pNVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar54;
  undefined4 uVar55;
  ulong uVar56;
  bool bVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vfloat_impl<4> vVar91;
  vfloat_impl<4> vVar92;
  vfloat_impl<4> vVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vfloat_impl<4> vVar96;
  vfloat_impl<4> vVar97;
  vfloat_impl<4> vVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar107;
  float fVar108;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar114;
  vint4 ai_2;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  vint4 ai_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 in_ZMM2 [64];
  float fVar125;
  float fVar132;
  float fVar133;
  vint4 ai_3;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar135;
  float fVar144;
  float fVar145;
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  float fVar147;
  float fVar152;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  float fVar159;
  float fVar160;
  vint4 bi_3;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar162;
  float fVar165;
  float fVar166;
  vint4 bi_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar168;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar181;
  float fVar182;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar184;
  float fVar188;
  float fVar189;
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar196 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_3618 [16];
  undefined1 local_3608 [16];
  undefined1 local_35f8 [16];
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar61 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar66 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar66,5);
    uVar60 = vpcmpeqd_avx512vl(auVar61,(undefined1  [16])valid_i->field_0);
    uVar60 = ((byte)uVar10 & 0xf) & uVar60;
    bVar40 = (byte)uVar60;
    if (bVar40 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar205 = ZEXT1664(auVar61);
      auVar62 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar61);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar206 = ZEXT1664(auVar63);
      uVar42 = vcmpps_avx512vl(auVar62,auVar63,1);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar207 = ZEXT1664(auVar62);
      auVar64 = vdivps_avx512vl(auVar62,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar65 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar61);
      uVar11 = vcmpps_avx512vl(auVar65,auVar63,1);
      auVar65 = vdivps_avx512vl(auVar62,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar61 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar61);
      uVar59 = vcmpps_avx512vl(auVar61,auVar63,1);
      auVar61 = vdivps_avx512vl(auVar62,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar57 = (bool)((byte)uVar42 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar64._0_4_;
      bVar57 = (bool)((byte)(uVar42 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar64._4_4_;
      bVar57 = (bool)((byte)(uVar42 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar64._8_4_;
      bVar57 = (bool)((byte)(uVar42 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar64._12_4_;
      bVar57 = (bool)((byte)uVar11 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar65._0_4_;
      bVar57 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar65._4_4_;
      bVar57 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar65._8_4_;
      bVar57 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar65._12_4_;
      bVar57 = (bool)((byte)uVar59 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar61._0_4_;
      bVar57 = (bool)((byte)(uVar59 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar61._4_4_;
      bVar57 = (bool)((byte)(uVar59 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar61._8_4_;
      bVar57 = (bool)((byte)(uVar59 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar57 * 0x5d5e0b6b | (uint)!bVar57 * auVar61._12_4_;
      uVar42 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar66,1);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar42 & 1) * auVar61._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar42 >> 1) & 1) * auVar61._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar42 >> 2) & 1) * auVar61._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar42 >> 3) & 1) * auVar61._12_4_;
      uVar42 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar66,5);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar57 = (bool)((byte)uVar42 & 1);
      bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar42 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar42 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar57 * auVar61._0_4_ | (uint)!bVar57 * 0x60;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar61._4_4_ | (uint)!bVar7 * 0x60;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar61._8_4_ | (uint)!bVar8 * 0x60;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar61._12_4_ | (uint)!bVar9 * 0x60;
      uVar42 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar66,5);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar57 = (bool)((byte)uVar42 & 1);
      bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar42 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar42 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar57 * auVar61._0_4_ | (uint)!bVar57 * 0xa0;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar61._4_4_ | (uint)!bVar7 * 0xa0;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar61._8_4_ | (uint)!bVar8 * 0xa0;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar61._12_4_ | (uint)!bVar9 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar209 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar61 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar66);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar40 & 1) * auVar61._0_4_ |
           (uint)!(bool)(bVar40 & 1) * stack_near[0].field_0._0_4_;
      bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar57 * auVar61._4_4_ | (uint)!bVar57 * stack_near[0].field_0._4_4_;
      bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar57 * auVar61._8_4_ | (uint)!bVar57 * stack_near[0].field_0._8_4_;
      bVar57 = SUB81(uVar60 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar57 * auVar61._12_4_ | (uint)!bVar57 * stack_near[0].field_0._12_4_;
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar208 = ZEXT1664(auVar61);
      auVar66 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar66);
      tray.tfar.field_0.i[0] =
           (uint)(bVar40 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar40 & 1) * auVar61._0_4_;
      bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar57 * auVar66._4_4_ | (uint)!bVar57 * auVar61._4_4_;
      bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar57 * auVar66._8_4_ | (uint)!bVar57 * auVar61._8_4_;
      bVar57 = SUB81(uVar60 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar57 * auVar66._12_4_ | (uint)!bVar57 * auVar61._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar48 = 3;
      }
      else {
        uVar48 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar44 = (ushort)uVar60 ^ 0xf;
      pNVar53 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar54 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar210 = ZEXT1664(auVar61);
      auVar196 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar204 = ZEXT1664(auVar61);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar203 = ZEXT1664(auVar61);
      do {
        paVar54 = paVar54 + -1;
        root.ptr = pNVar53[-1].ptr;
        pNVar53 = pNVar53 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00820d4e:
          iVar41 = 3;
        }
        else {
          aVar2 = *paVar54;
          uVar60 = vcmpps_avx512vl((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar60 == '\0') {
LAB_00820d83:
            iVar41 = 2;
          }
          else {
            uVar55 = (undefined4)uVar60;
            iVar41 = 0;
            if ((uint)POPCOUNT(uVar55) <= uVar48) {
              do {
                sVar3 = 0;
                for (uVar42 = uVar60; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000)
                {
                  sVar3 = sVar3 + 1;
                }
                bVar57 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
                bVar39 = (byte)(1 << ((uint)sVar3 & 0x1f));
                if (!bVar57) {
                  bVar39 = 0;
                }
                bVar39 = (byte)uVar44 | bVar39;
                uVar44 = (ushort)bVar39;
                uVar60 = uVar60 - 1 & uVar60;
              } while (uVar60 != 0);
              if (bVar39 == 0xf) {
                iVar41 = 3;
              }
              else {
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar39 & 1) * auVar61._0_4_ |
                     (uint)!(bool)(bVar39 & 1) * tray.tfar.field_0.i[0];
                bVar57 = (bool)(bVar39 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar57 * auVar61._4_4_ | (uint)!bVar57 * tray.tfar.field_0.i[1];
                bVar57 = (bool)(bVar39 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar57 * auVar61._8_4_ | (uint)!bVar57 * tray.tfar.field_0.i[2];
                bVar57 = (bool)(bVar39 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar57 * auVar61._12_4_ | (uint)!bVar57 * tray.tfar.field_0.i[3];
                iVar41 = 2;
              }
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar205 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar206 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar207 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar208 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar209 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar210 = ZEXT1664(auVar61);
              auVar196 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar204 = ZEXT1664(auVar61);
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar203 = ZEXT1664(auVar61);
            }
            auVar202 = ZEXT1664((undefined1  [16])aVar2);
            if (uVar48 < (uint)POPCOUNT(uVar55)) {
              do {
                uVar46 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00820d4e;
                  uVar10 = vcmpps_avx512vl(auVar202._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar10 != '\0') {
                    uVar60 = (ulong)(uVar46 & 0xf);
                    bVar39 = (byte)uVar44 & 0xf;
                    if (uVar60 != 8) {
                      bVar39 = bVar39 ^ 0xf;
                      uVar42 = 0;
                      do {
                        lVar52 = uVar42 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar11 = 0;
                        uVar43 = (ulong)bVar39;
                        for (uVar59 = uVar43; (uVar59 & 1) == 0;
                            uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                          uVar11 = uVar11 + 1;
                        }
                        uVar59 = uVar43;
                        uVar56 = 0;
                        while (bVar47 = (byte)uVar59, *(int *)(lVar52 + 0x50 + uVar56 * 4) != -1) {
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar52 + 0x40 + uVar56 * 4)].ptr;
                          fVar103 = (pGVar4->time_range).lower;
                          auVar61._4_4_ = fVar103;
                          auVar61._0_4_ = fVar103;
                          auVar61._8_4_ = fVar103;
                          auVar61._12_4_ = fVar103;
                          fVar107 = pGVar4->fnumTimeSegments;
                          auVar61 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar61);
                          fVar103 = (pGVar4->time_range).upper - fVar103;
                          auVar66._4_4_ = fVar103;
                          auVar66._0_4_ = fVar103;
                          auVar66._8_4_ = fVar103;
                          auVar66._12_4_ = fVar103;
                          auVar61 = vdivps_avx(auVar61,auVar66);
                          auVar62._0_4_ = fVar107 * auVar61._0_4_;
                          auVar62._4_4_ = fVar107 * auVar61._4_4_;
                          auVar62._8_4_ = fVar107 * auVar61._8_4_;
                          auVar62._12_4_ = fVar107 * auVar61._12_4_;
                          auVar61 = vroundps_avx(auVar62,1);
                          fVar107 = fVar107 + -1.0;
                          auVar63._4_4_ = fVar107;
                          auVar63._0_4_ = fVar107;
                          auVar63._8_4_ = fVar107;
                          auVar63._12_4_ = fVar107;
                          auVar61 = vminps_avx(auVar61,auVar63);
                          auVar61 = vmaxps_avx(auVar61,_DAT_01feba10);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar61);
                          auVar61 = vsubps_avx(auVar62,auVar61);
                          auVar66 = vpbroadcastd_avx512vl();
                          uVar10 = vpcmpeqd_avx512vl(auVar66,(undefined1  [16])itime.field_0);
                          auVar66 = auVar207._0_16_;
                          if (((byte)uVar10 & 0xf | ~bVar39 & 0xf) == 0xf) {
                            lVar49 = (long)itime.field_0.i[uVar11] * 0x38;
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar49);
                            lVar49 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar49);
                            uVar58 = (ulong)*(uint *)(lVar52 + uVar56 * 4);
                            uVar51 = (ulong)*(uint *)(lVar52 + 0x10 + uVar56 * 4);
                            auVar62 = vsubps_avx512vl(auVar66,auVar61);
                            uVar55 = *(undefined4 *)(lVar49 + uVar58 * 4);
                            auVar77._4_4_ = uVar55;
                            auVar77._0_4_ = uVar55;
                            auVar77._8_4_ = uVar55;
                            auVar77._12_4_ = uVar55;
                            auVar63 = vmulps_avx512vl(auVar61,auVar77);
                            uVar55 = *(undefined4 *)(lVar49 + 4 + uVar58 * 4);
                            auVar78._4_4_ = uVar55;
                            auVar78._0_4_ = uVar55;
                            auVar78._8_4_ = uVar55;
                            auVar78._12_4_ = uVar55;
                            auVar64 = vmulps_avx512vl(auVar61,auVar78);
                            uVar55 = *(undefined4 *)(lVar49 + 8 + uVar58 * 4);
                            auVar79._4_4_ = uVar55;
                            auVar79._0_4_ = uVar55;
                            auVar79._8_4_ = uVar55;
                            auVar79._12_4_ = uVar55;
                            auVar65 = vmulps_avx512vl(auVar61,auVar79);
                            uVar55 = *(undefined4 *)(lVar5 + uVar58 * 4);
                            auVar80._4_4_ = uVar55;
                            auVar80._0_4_ = uVar55;
                            auVar80._8_4_ = uVar55;
                            auVar80._12_4_ = uVar55;
                            auVar68 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar80);
                            uVar55 = *(undefined4 *)(lVar5 + 4 + uVar58 * 4);
                            auVar81._4_4_ = uVar55;
                            auVar81._0_4_ = uVar55;
                            auVar81._8_4_ = uVar55;
                            auVar81._12_4_ = uVar55;
                            auVar69 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar81);
                            uVar55 = *(undefined4 *)(lVar5 + 8 + uVar58 * 4);
                            auVar82._4_4_ = uVar55;
                            auVar82._0_4_ = uVar55;
                            auVar82._8_4_ = uVar55;
                            auVar82._12_4_ = uVar55;
                            auVar70 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar82);
                            uVar55 = *(undefined4 *)(lVar49 + uVar51 * 4);
                            auVar83._4_4_ = uVar55;
                            auVar83._0_4_ = uVar55;
                            auVar83._8_4_ = uVar55;
                            auVar83._12_4_ = uVar55;
                            auVar63 = vmulps_avx512vl(auVar61,auVar83);
                            uVar55 = *(undefined4 *)(lVar49 + 4 + uVar51 * 4);
                            auVar84._4_4_ = uVar55;
                            auVar84._0_4_ = uVar55;
                            auVar84._8_4_ = uVar55;
                            auVar84._12_4_ = uVar55;
                            auVar64 = vmulps_avx512vl(auVar61,auVar84);
                            uVar55 = *(undefined4 *)(lVar49 + 8 + uVar51 * 4);
                            auVar85._4_4_ = uVar55;
                            auVar85._0_4_ = uVar55;
                            auVar85._8_4_ = uVar55;
                            auVar85._12_4_ = uVar55;
                            auVar65 = vmulps_avx512vl(auVar61,auVar85);
                            uVar55 = *(undefined4 *)(lVar5 + uVar51 * 4);
                            auVar86._4_4_ = uVar55;
                            auVar86._0_4_ = uVar55;
                            auVar86._8_4_ = uVar55;
                            auVar86._12_4_ = uVar55;
                            auVar71 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar86);
                            uVar55 = *(undefined4 *)(lVar5 + 4 + uVar51 * 4);
                            auVar90._4_4_ = uVar55;
                            auVar90._0_4_ = uVar55;
                            auVar90._8_4_ = uVar55;
                            auVar90._12_4_ = uVar55;
                            auVar72 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar90);
                            uVar55 = *(undefined4 *)(lVar5 + 8 + uVar51 * 4);
                            auVar23._4_4_ = uVar55;
                            auVar23._0_4_ = uVar55;
                            auVar23._8_4_ = uVar55;
                            auVar23._12_4_ = uVar55;
                            auVar73 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar23);
                            uVar58 = (ulong)*(uint *)(lVar52 + 0x20 + uVar56 * 4);
                            uVar55 = *(undefined4 *)(lVar49 + uVar58 * 4);
                            auVar24._4_4_ = uVar55;
                            auVar24._0_4_ = uVar55;
                            auVar24._8_4_ = uVar55;
                            auVar24._12_4_ = uVar55;
                            auVar63 = vmulps_avx512vl(auVar61,auVar24);
                            uVar55 = *(undefined4 *)(lVar49 + 4 + uVar58 * 4);
                            auVar25._4_4_ = uVar55;
                            auVar25._0_4_ = uVar55;
                            auVar25._8_4_ = uVar55;
                            auVar25._12_4_ = uVar55;
                            auVar64 = vmulps_avx512vl(auVar61,auVar25);
                            uVar55 = *(undefined4 *)(lVar49 + 8 + uVar58 * 4);
                            auVar26._4_4_ = uVar55;
                            auVar26._0_4_ = uVar55;
                            auVar26._8_4_ = uVar55;
                            auVar26._12_4_ = uVar55;
                            auVar65 = vmulps_avx512vl(auVar61,auVar26);
                            uVar55 = *(undefined4 *)(lVar5 + uVar58 * 4);
                            auVar27._4_4_ = uVar55;
                            auVar27._0_4_ = uVar55;
                            auVar27._8_4_ = uVar55;
                            auVar27._12_4_ = uVar55;
                            local_35f8 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar27);
                            uVar55 = *(undefined4 *)(lVar5 + 4 + uVar58 * 4);
                            auVar28._4_4_ = uVar55;
                            auVar28._0_4_ = uVar55;
                            auVar28._8_4_ = uVar55;
                            auVar28._12_4_ = uVar55;
                            local_3608 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar28);
                            uVar55 = *(undefined4 *)(lVar5 + 8 + uVar58 * 4);
                            auVar29._4_4_ = uVar55;
                            auVar29._0_4_ = uVar55;
                            auVar29._8_4_ = uVar55;
                            auVar29._12_4_ = uVar55;
                            local_3618 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar29);
                            uVar58 = (ulong)*(uint *)(lVar52 + 0x30 + uVar56 * 4);
                            uVar55 = *(undefined4 *)(lVar49 + uVar58 * 4);
                            auVar30._4_4_ = uVar55;
                            auVar30._0_4_ = uVar55;
                            auVar30._8_4_ = uVar55;
                            auVar30._12_4_ = uVar55;
                            auVar63 = vmulps_avx512vl(auVar61,auVar30);
                            uVar55 = *(undefined4 *)(lVar49 + 4 + uVar58 * 4);
                            auVar31._4_4_ = uVar55;
                            auVar31._0_4_ = uVar55;
                            auVar31._8_4_ = uVar55;
                            auVar31._12_4_ = uVar55;
                            auVar64 = vmulps_avx512vl(auVar61,auVar31);
                            uVar55 = *(undefined4 *)(lVar49 + 8 + uVar58 * 4);
                            auVar32._4_4_ = uVar55;
                            auVar32._0_4_ = uVar55;
                            auVar32._8_4_ = uVar55;
                            auVar32._12_4_ = uVar55;
                            auVar65 = vmulps_avx512vl(auVar61,auVar32);
                            uVar55 = *(undefined4 *)(lVar5 + uVar58 * 4);
                            auVar33._4_4_ = uVar55;
                            auVar33._0_4_ = uVar55;
                            auVar33._8_4_ = uVar55;
                            auVar33._12_4_ = uVar55;
                            auVar63 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar33);
                            uVar55 = *(undefined4 *)(lVar5 + 4 + uVar58 * 4);
                            auVar34._4_4_ = uVar55;
                            auVar34._0_4_ = uVar55;
                            auVar34._8_4_ = uVar55;
                            auVar34._12_4_ = uVar55;
                            auVar61 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar34);
                            uVar55 = *(undefined4 *)(lVar5 + 8 + uVar58 * 4);
                            auVar35._4_4_ = uVar55;
                            auVar35._0_4_ = uVar55;
                            auVar35._8_4_ = uVar55;
                            auVar35._12_4_ = uVar55;
                            auVar62 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar35);
                          }
                          else {
                            uVar10 = p1.field_0._0_8_;
                            uVar12 = p1.field_0._32_8_;
                            uVar13 = p1.field_0._24_8_;
                            if (bVar39 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar50 = (ulong)*(uint *)(lVar52 + uVar56 * 4);
                              uVar51 = uVar43;
                              uVar58 = uVar11;
                              do {
                                lVar49 = (long)itime.field_0.i[uVar58] * 0x38;
                                auVar62 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar49) + uVar50 * 4);
                                auVar63 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar49) + uVar50 * 4);
                                *(int *)((long)&p0.field_0 + uVar58 * 4) = auVar62._0_4_;
                                uVar55 = vextractps_avx(auVar62,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar62,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                *(int *)((long)&p1.field_0 + uVar58 * 4) = auVar63._0_4_;
                                uVar55 = vextractps_avx(auVar63,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar63,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                                uVar58 = 0;
                                for (uVar14 = uVar51; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar58 = uVar58 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar12 = p1.field_0._32_8_;
                                uVar13 = p1.field_0._24_8_;
                              } while (uVar51 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar13;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar12;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            auVar62 = vsubps_avx512vl(auVar66,auVar61);
                            fVar110 = auVar62._0_4_;
                            fVar116 = fVar110 * (float)p0.field_0._0_4_;
                            fVar113 = auVar62._4_4_;
                            fVar122 = fVar113 * (float)p0.field_0._4_4_;
                            fVar114 = auVar62._8_4_;
                            fVar123 = fVar114 * (float)p0.field_0._8_4_;
                            fVar115 = auVar62._12_4_;
                            fVar124 = fVar115 * (float)p0.field_0._12_4_;
                            fVar125 = fVar110 * (float)p0.field_0._16_4_;
                            fVar132 = fVar113 * (float)p0.field_0._20_4_;
                            fVar133 = fVar114 * (float)p0.field_0._24_4_;
                            fVar134 = fVar115 * (float)p0.field_0._28_4_;
                            fVar135 = fVar110 * (float)p0.field_0._32_4_;
                            fVar144 = fVar113 * (float)p0.field_0._36_4_;
                            fVar145 = fVar114 * (float)p0.field_0._40_4_;
                            fVar146 = fVar115 * (float)p0.field_0._44_4_;
                            fVar103 = auVar61._0_4_;
                            fVar147 = fVar103 * (float)p1.field_0._0_4_;
                            fVar107 = auVar61._4_4_;
                            fVar152 = fVar107 * (float)p1.field_0._4_4_;
                            fVar108 = auVar61._8_4_;
                            fVar153 = fVar108 * (float)p1.field_0._8_4_;
                            fVar109 = auVar61._12_4_;
                            fVar154 = fVar109 * (float)p1.field_0._12_4_;
                            fVar155 = fVar103 * (float)p1.field_0._16_4_;
                            fVar159 = fVar107 * (float)p1.field_0._20_4_;
                            fVar160 = fVar108 * (float)p1.field_0._24_4_;
                            fVar161 = fVar109 * (float)p1.field_0._28_4_;
                            fVar162 = fVar103 * (float)p1.field_0._32_4_;
                            fVar165 = fVar107 * (float)p1.field_0._36_4_;
                            fVar166 = fVar108 * (float)p1.field_0._40_4_;
                            fVar167 = fVar109 * (float)p1.field_0._44_4_;
                            if (bVar39 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar50 = (ulong)*(uint *)(lVar52 + 0x10 + uVar56 * 4);
                              uVar51 = uVar43;
                              uVar58 = uVar11;
                              p1.field_0._0_8_ = uVar10;
                              p1.field_0._32_8_ = uVar12;
                              p1.field_0._24_8_ = uVar13;
                              do {
                                lVar49 = (long)itime.field_0.i[uVar58] * 0x38;
                                auVar63 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar49) + uVar50 * 4);
                                auVar64 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar49) + uVar50 * 4);
                                *(int *)((long)&p0.field_0 + uVar58 * 4) = auVar63._0_4_;
                                uVar55 = vextractps_avx(auVar63,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar63,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                *(int *)((long)&p1.field_0 + uVar58 * 4) = auVar64._0_4_;
                                uVar55 = vextractps_avx(auVar64,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar64,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                                uVar58 = 0;
                                for (uVar14 = uVar51; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar58 = uVar58 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar12 = p1.field_0._32_8_;
                                uVar13 = p1.field_0._24_8_;
                              } while (uVar51 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar13;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar12;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            fVar168 = fVar110 * (float)p0.field_0._0_4_;
                            fVar171 = fVar113 * (float)p0.field_0._4_4_;
                            fVar172 = fVar114 * (float)p0.field_0._8_4_;
                            fVar173 = fVar115 * (float)p0.field_0._12_4_;
                            fVar174 = fVar110 * (float)p0.field_0._16_4_;
                            fVar175 = fVar113 * (float)p0.field_0._20_4_;
                            fVar176 = fVar114 * (float)p0.field_0._24_4_;
                            fVar177 = fVar115 * (float)p0.field_0._28_4_;
                            fVar178 = fVar110 * (float)p0.field_0._32_4_;
                            fVar181 = fVar113 * (float)p0.field_0._36_4_;
                            fVar182 = fVar114 * (float)p0.field_0._40_4_;
                            fVar183 = fVar115 * (float)p0.field_0._44_4_;
                            fVar184 = fVar103 * (float)p1.field_0._0_4_;
                            fVar188 = fVar107 * (float)p1.field_0._4_4_;
                            fVar189 = fVar108 * (float)p1.field_0._8_4_;
                            fVar190 = fVar109 * (float)p1.field_0._12_4_;
                            fVar191 = fVar103 * (float)p1.field_0._16_4_;
                            fVar192 = fVar107 * (float)p1.field_0._20_4_;
                            fVar193 = fVar108 * (float)p1.field_0._24_4_;
                            fVar194 = fVar109 * (float)p1.field_0._28_4_;
                            fVar195 = fVar103 * (float)p1.field_0._32_4_;
                            fVar197 = fVar107 * (float)p1.field_0._36_4_;
                            fVar198 = fVar108 * (float)p1.field_0._40_4_;
                            fVar199 = fVar109 * (float)p1.field_0._44_4_;
                            p1.field_0._0_8_ = uVar10;
                            p1.field_0._32_8_ = uVar12;
                            if (bVar39 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar50 = (ulong)*(uint *)(lVar52 + 0x20 + uVar56 * 4);
                              uVar51 = uVar43;
                              uVar58 = uVar11;
                              p1.field_0._24_8_ = uVar13;
                              do {
                                lVar49 = (long)itime.field_0.i[uVar58] * 0x38;
                                auVar63 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar49) + uVar50 * 4);
                                auVar64 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar49) + uVar50 * 4);
                                *(int *)((long)&p0.field_0 + uVar58 * 4) = auVar63._0_4_;
                                uVar55 = vextractps_avx(auVar63,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar63,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                *(int *)((long)&p1.field_0 + uVar58 * 4) = auVar64._0_4_;
                                uVar55 = vextractps_avx(auVar64,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx(auVar64,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                                uVar58 = 0;
                                for (uVar14 = uVar51; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar58 = uVar58 + 1;
                                }
                                uVar13 = p1.field_0._24_8_;
                              } while (uVar51 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar13;
                            auVar95._0_4_ = fVar110 * (float)p0.field_0._0_4_;
                            auVar95._4_4_ = fVar113 * (float)p0.field_0._4_4_;
                            auVar95._8_4_ = fVar114 * (float)p0.field_0._8_4_;
                            auVar95._12_4_ = fVar115 * (float)p0.field_0._12_4_;
                            auVar62 = vmulps_avx512vl(auVar62,(undefined1  [16])
                                                              p0.field_0.field_0.y.field_0);
                            auVar94._0_4_ = fVar110 * (float)p0.field_0._32_4_;
                            auVar94._4_4_ = fVar113 * (float)p0.field_0._36_4_;
                            auVar94._8_4_ = fVar114 * (float)p0.field_0._40_4_;
                            auVar94._12_4_ = fVar115 * (float)p0.field_0._44_4_;
                            auVar64._8_4_ = p1.field_0._8_4_;
                            auVar64._0_8_ = p1.field_0._0_8_;
                            auVar64._12_4_ = p1.field_0._12_4_;
                            auVar63 = vmulps_avx512vl(auVar61,auVar64);
                            auVar65._4_4_ = p1.field_0._20_4_;
                            auVar65._0_4_ = p1.field_0._16_4_;
                            auVar65._8_4_ = p1.field_0._24_4_;
                            auVar65._12_4_ = p1.field_0._28_4_;
                            auVar64 = vmulps_avx512vl(auVar61,auVar65);
                            auVar67._8_4_ = p1.field_0._40_4_;
                            auVar67._0_8_ = p1.field_0._32_8_;
                            auVar67._12_4_ = p1.field_0._44_4_;
                            auVar61 = vmulps_avx512vl(auVar61,auVar67);
                            uVar10 = p1.field_0._0_8_;
                            uVar12 = p1.field_0._32_8_;
                            if (bVar39 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar50 = (ulong)*(uint *)(lVar52 + 0x30 + uVar56 * 4);
                              uVar51 = uVar43;
                              uVar58 = uVar11;
                              p1.field_0._24_8_ = uVar13;
                              do {
                                lVar49 = (long)itime.field_0.i[uVar58] * 0x38;
                                auVar65 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar5 + lVar49) +
                                                              uVar50 * 4));
                                auVar67 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar5 + 0x38 + lVar49) +
                                                              uVar50 * 4));
                                *(int *)((long)&p0.field_0 + uVar58 * 4) = auVar65._0_4_;
                                uVar55 = vextractps_avx512f(auVar65,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx512f(auVar65,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                *(int *)((long)&p1.field_0 + uVar58 * 4) = auVar67._0_4_;
                                uVar55 = vextractps_avx512f(auVar67,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x10) = uVar55;
                                uVar55 = vextractps_avx512f(auVar67,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar58 * 4 + 0x20) = uVar55;
                                uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                                uVar58 = 0;
                                for (uVar14 = uVar51; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar58 = uVar58 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar12 = p1.field_0._32_8_;
                                uVar13 = p1.field_0._24_8_;
                              } while (uVar51 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar13;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar12;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            auVar68._0_4_ = fVar116 + fVar147;
                            auVar68._4_4_ = fVar122 + fVar152;
                            auVar68._8_4_ = fVar123 + fVar153;
                            auVar68._12_4_ = fVar124 + fVar154;
                            auVar69._0_4_ = fVar125 + fVar155;
                            auVar69._4_4_ = fVar132 + fVar159;
                            auVar69._8_4_ = fVar133 + fVar160;
                            auVar69._12_4_ = fVar134 + fVar161;
                            auVar70._0_4_ = fVar135 + fVar162;
                            auVar70._4_4_ = fVar144 + fVar165;
                            auVar70._8_4_ = fVar145 + fVar166;
                            auVar70._12_4_ = fVar146 + fVar167;
                            auVar71._0_4_ = fVar168 + fVar184;
                            auVar71._4_4_ = fVar171 + fVar188;
                            auVar71._8_4_ = fVar172 + fVar189;
                            auVar71._12_4_ = fVar173 + fVar190;
                            auVar72._0_4_ = fVar174 + fVar191;
                            auVar72._4_4_ = fVar175 + fVar192;
                            auVar72._8_4_ = fVar176 + fVar193;
                            auVar72._12_4_ = fVar177 + fVar194;
                            auVar73._0_4_ = fVar178 + fVar195;
                            auVar73._4_4_ = fVar181 + fVar197;
                            auVar73._8_4_ = fVar182 + fVar198;
                            auVar73._12_4_ = fVar183 + fVar199;
                            local_35f8 = vaddps_avx512vl(auVar95,auVar63);
                            local_3608 = vaddps_avx512vl(auVar62,auVar64);
                            auVar88._0_4_ = fVar110 * (float)p0.field_0._0_4_;
                            auVar88._4_4_ = fVar113 * (float)p0.field_0._4_4_;
                            auVar88._8_4_ = fVar114 * (float)p0.field_0._8_4_;
                            auVar88._12_4_ = fVar115 * (float)p0.field_0._12_4_;
                            auVar75._0_4_ = fVar110 * (float)p0.field_0._16_4_;
                            auVar75._4_4_ = fVar113 * (float)p0.field_0._20_4_;
                            auVar75._8_4_ = fVar114 * (float)p0.field_0._24_4_;
                            auVar75._12_4_ = fVar115 * (float)p0.field_0._28_4_;
                            local_3618 = vaddps_avx512vl(auVar94,auVar61);
                            auVar87._0_4_ = fVar110 * (float)p0.field_0._32_4_;
                            auVar87._4_4_ = fVar113 * (float)p0.field_0._36_4_;
                            auVar87._8_4_ = fVar114 * (float)p0.field_0._40_4_;
                            auVar87._12_4_ = fVar115 * (float)p0.field_0._44_4_;
                            auVar76._0_4_ = fVar103 * (float)p1.field_0._0_4_;
                            auVar76._4_4_ = fVar107 * (float)p1.field_0._4_4_;
                            auVar76._8_4_ = fVar108 * (float)p1.field_0._8_4_;
                            auVar76._12_4_ = fVar109 * (float)p1.field_0._12_4_;
                            auVar63 = vaddps_avx512vl(auVar88,auVar76);
                            auVar74._0_4_ = fVar103 * (float)p1.field_0._16_4_;
                            auVar74._4_4_ = fVar107 * (float)p1.field_0._20_4_;
                            auVar74._8_4_ = fVar108 * (float)p1.field_0._24_4_;
                            auVar74._12_4_ = fVar109 * (float)p1.field_0._28_4_;
                            auVar61 = vaddps_avx512vl(auVar75,auVar74);
                            auVar89._0_4_ = fVar103 * (float)p1.field_0._32_4_;
                            auVar89._4_4_ = fVar107 * (float)p1.field_0._36_4_;
                            auVar89._8_4_ = fVar108 * (float)p1.field_0._40_4_;
                            auVar89._12_4_ = fVar109 * (float)p1.field_0._44_4_;
                            auVar62 = vaddps_avx512vl(auVar87,auVar89);
                            p1.field_0._0_8_ = uVar10;
                            p1.field_0._32_8_ = uVar12;
                            p1.field_0._24_8_ = uVar13;
                          }
                          auVar64 = *(undefined1 (*) [16])ray;
                          auVar65 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar67 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar94 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar95 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar89 = *(undefined1 (*) [16])(ray + 0x60);
                          auVar68 = vsubps_avx(auVar68,auVar64);
                          auVar69 = vsubps_avx(auVar69,auVar65);
                          auVar70 = vsubps_avx(auVar70,auVar67);
                          auVar87 = vsubps_avx(auVar71,auVar64);
                          auVar88 = vsubps_avx(auVar72,auVar65);
                          auVar74 = vsubps_avx512vl(auVar73,auVar67);
                          auVar75 = vsubps_avx512vl(auVar63,auVar64);
                          auVar76 = vsubps_avx512vl(auVar61,auVar65);
                          auVar77 = vsubps_avx512vl(auVar62,auVar67);
                          auVar78 = vsubps_avx512vl(auVar75,auVar68);
                          auVar79 = vsubps_avx512vl(auVar76,auVar69);
                          auVar80 = vsubps_avx512vl(auVar77,auVar70);
                          auVar81 = vsubps_avx512vl(auVar68,auVar87);
                          auVar82 = vsubps_avx512vl(auVar69,auVar88);
                          auVar83 = vsubps_avx512vl(auVar70,auVar74);
                          auVar67 = vaddps_avx512vl(auVar75,auVar68);
                          auVar84 = vaddps_avx512vl(auVar76,auVar69);
                          auVar64 = vaddps_avx512vl(auVar77,auVar70);
                          auVar138._0_4_ = auVar80._0_4_ * auVar84._0_4_;
                          auVar138._4_4_ = auVar80._4_4_ * auVar84._4_4_;
                          auVar138._8_4_ = auVar80._8_4_ * auVar84._8_4_;
                          auVar138._12_4_ = auVar80._12_4_ * auVar84._12_4_;
                          auVar65 = vfmsub231ps_fma(auVar138,auVar79,auVar64);
                          auVar120._0_4_ = auVar78._0_4_ * auVar64._0_4_;
                          auVar120._4_4_ = auVar78._4_4_ * auVar64._4_4_;
                          auVar120._8_4_ = auVar78._8_4_ * auVar64._8_4_;
                          auVar120._12_4_ = auVar78._12_4_ * auVar64._12_4_;
                          auVar64 = vfmsub231ps_fma(auVar120,auVar80,auVar67);
                          auVar104._0_4_ = auVar79._0_4_ * auVar67._0_4_;
                          auVar104._4_4_ = auVar79._4_4_ * auVar67._4_4_;
                          auVar104._8_4_ = auVar79._8_4_ * auVar67._8_4_;
                          auVar104._12_4_ = auVar79._12_4_ * auVar67._12_4_;
                          auVar67 = vfmsub231ps_fma(auVar104,auVar78,auVar84);
                          fVar103 = auVar89._0_4_;
                          auVar105._0_4_ = fVar103 * auVar67._0_4_;
                          fVar107 = auVar89._4_4_;
                          auVar105._4_4_ = fVar107 * auVar67._4_4_;
                          fVar108 = auVar89._8_4_;
                          auVar105._8_4_ = fVar108 * auVar67._8_4_;
                          fVar109 = auVar89._12_4_;
                          auVar105._12_4_ = fVar109 * auVar67._12_4_;
                          auVar64 = vfmadd231ps_fma(auVar105,auVar95,auVar64);
                          auVar64 = vfmadd231ps_fma(auVar64,auVar94,auVar65);
                          auVar112._0_4_ = auVar87._0_4_ + auVar68._0_4_;
                          auVar112._4_4_ = auVar87._4_4_ + auVar68._4_4_;
                          auVar112._8_4_ = auVar87._8_4_ + auVar68._8_4_;
                          auVar112._12_4_ = auVar87._12_4_ + auVar68._12_4_;
                          auVar121._0_4_ = auVar88._0_4_ + auVar69._0_4_;
                          auVar121._4_4_ = auVar88._4_4_ + auVar69._4_4_;
                          auVar121._8_4_ = auVar88._8_4_ + auVar69._8_4_;
                          auVar121._12_4_ = auVar88._12_4_ + auVar69._12_4_;
                          auVar65 = vaddps_avx512vl(auVar70,auVar74);
                          auVar67 = vmulps_avx512vl(auVar121,auVar83);
                          auVar67 = vfmsub231ps_avx512vl(auVar67,auVar82,auVar65);
                          auVar65 = vmulps_avx512vl(auVar65,auVar81);
                          auVar65 = vfmsub231ps_avx512vl(auVar65,auVar83,auVar112);
                          auVar84 = vmulps_avx512vl(auVar112,auVar82);
                          auVar84 = vfmsub231ps_avx512vl(auVar84,auVar81,auVar121);
                          auVar85 = vsubps_avx512vl(auVar87,auVar75);
                          auVar139._0_4_ = fVar103 * auVar84._0_4_;
                          auVar139._4_4_ = fVar107 * auVar84._4_4_;
                          auVar139._8_4_ = fVar108 * auVar84._8_4_;
                          auVar139._12_4_ = fVar109 * auVar84._12_4_;
                          auVar65 = vfmadd231ps_avx512vl(auVar139,auVar95,auVar65);
                          auVar84 = vsubps_avx512vl(auVar88,auVar76);
                          auVar65 = vfmadd231ps_fma(auVar65,auVar94,auVar67);
                          auVar86 = vsubps_avx512vl(auVar74,auVar77);
                          auVar67 = vaddps_avx512vl(auVar87,auVar75);
                          auVar87 = vaddps_avx512vl(auVar88,auVar76);
                          auVar88 = vaddps_avx512vl(auVar74,auVar77);
                          auVar74 = vmulps_avx512vl(auVar87,auVar86);
                          auVar74 = vfmsub231ps_avx512vl(auVar74,auVar84,auVar88);
                          auVar88 = vmulps_avx512vl(auVar88,auVar85);
                          auVar88 = vfmsub231ps_avx512vl(auVar88,auVar86,auVar67);
                          auVar200._0_4_ = auVar67._0_4_ * auVar84._0_4_;
                          auVar200._4_4_ = auVar67._4_4_ * auVar84._4_4_;
                          auVar200._8_4_ = auVar67._8_4_ * auVar84._8_4_;
                          auVar200._12_4_ = auVar67._12_4_ * auVar84._12_4_;
                          auVar67 = vfmsub231ps_fma(auVar200,auVar85,auVar87);
                          auVar67 = vmulps_avx512vl(auVar67,auVar89);
                          auVar67 = vfmadd231ps_avx512vl(auVar67,auVar95,auVar88);
                          auVar67 = vfmadd231ps_avx512vl(auVar67,auVar94,auVar74);
                          auVar201._0_4_ = auVar64._0_4_ + auVar65._0_4_;
                          auVar201._4_4_ = auVar64._4_4_ + auVar65._4_4_;
                          auVar201._8_4_ = auVar64._8_4_ + auVar65._8_4_;
                          auVar201._12_4_ = auVar64._12_4_ + auVar65._12_4_;
                          auVar89 = vaddps_avx512vl(auVar67,auVar201);
                          auVar76 = auVar205._0_16_;
                          auVar87 = vandps_avx512vl(auVar89,auVar76);
                          auVar88 = vmulps_avx512vl(auVar87,auVar204._0_16_);
                          auVar74 = vminps_avx512vl(auVar64,auVar65);
                          auVar74 = vminps_avx512vl(auVar74,auVar67);
                          auVar75 = vxorps_avx512vl(auVar88,auVar203._0_16_);
                          uVar10 = vcmpps_avx512vl(auVar74,auVar75,5);
                          auVar74 = vmaxps_avx512vl(auVar64,auVar65);
                          auVar67 = vmaxps_avx512vl(auVar74,auVar67);
                          uVar12 = vcmpps_avx512vl(auVar67,auVar88,2);
                          bVar45 = ((byte)uVar10 | (byte)uVar12) & 0xf & bVar47;
                          if (bVar45 != 0) {
                            auVar67 = vmulps_avx512vl(auVar82,auVar80);
                            auVar88 = vmulps_avx512vl(auVar78,auVar83);
                            auVar74 = vmulps_avx512vl(auVar81,auVar79);
                            auVar75 = vmulps_avx512vl(auVar84,auVar83);
                            auVar77 = vmulps_avx512vl(auVar81,auVar86);
                            auVar90 = vmulps_avx512vl(auVar85,auVar82);
                            auVar79 = vfmsub213ps_avx512vl(auVar79,auVar83,auVar67);
                            auVar80 = vfmsub213ps_avx512vl(auVar80,auVar81,auVar88);
                            auVar78 = vfmsub213ps_avx512vl(auVar78,auVar82,auVar74);
                            auVar82 = vfmsub213ps_avx512vl(auVar86,auVar82,auVar75);
                            auVar83 = vfmsub213ps_avx512vl(auVar85,auVar83,auVar77);
                            auVar81 = vfmsub213ps_avx512vl(auVar84,auVar81,auVar90);
                            auVar67 = vandps_avx512vl(auVar67,auVar76);
                            auVar75 = vandps_avx512vl(auVar75,auVar76);
                            uVar58 = vcmpps_avx512vl(auVar67,auVar75,1);
                            auVar67 = vandps_avx512vl(auVar88,auVar76);
                            auVar88 = vandps_avx512vl(auVar77,auVar76);
                            uVar51 = vcmpps_avx512vl(auVar67,auVar88,1);
                            auVar67 = vandps_avx512vl(auVar74,auVar76);
                            auVar88 = vandps_avx512vl(auVar90,auVar76);
                            auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar203 = ZEXT1664(auVar74);
                            uVar50 = vcmpps_avx512vl(auVar67,auVar88,1);
                            bVar57 = (bool)((byte)uVar58 & 1);
                            vVar91.field_0._0_4_ =
                                 (uint)bVar57 * auVar79._0_4_ | (uint)!bVar57 * auVar82._0_4_;
                            bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
                            vVar91.field_0._4_4_ =
                                 (uint)bVar57 * auVar79._4_4_ | (uint)!bVar57 * auVar82._4_4_;
                            bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
                            vVar91.field_0._8_4_ =
                                 (uint)bVar57 * auVar79._8_4_ | (uint)!bVar57 * auVar82._8_4_;
                            bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
                            vVar91.field_0._12_4_ =
                                 (uint)bVar57 * auVar79._12_4_ | (uint)!bVar57 * auVar82._12_4_;
                            bVar57 = (bool)((byte)uVar51 & 1);
                            vVar92.field_0._0_4_ =
                                 (uint)bVar57 * auVar80._0_4_ | (uint)!bVar57 * auVar83._0_4_;
                            bVar57 = (bool)((byte)(uVar51 >> 1) & 1);
                            vVar92.field_0._4_4_ =
                                 (uint)bVar57 * auVar80._4_4_ | (uint)!bVar57 * auVar83._4_4_;
                            bVar57 = (bool)((byte)(uVar51 >> 2) & 1);
                            vVar92.field_0._8_4_ =
                                 (uint)bVar57 * auVar80._8_4_ | (uint)!bVar57 * auVar83._8_4_;
                            bVar57 = (bool)((byte)(uVar51 >> 3) & 1);
                            vVar92.field_0._12_4_ =
                                 (uint)bVar57 * auVar80._12_4_ | (uint)!bVar57 * auVar83._12_4_;
                            bVar57 = (bool)((byte)uVar50 & 1);
                            vVar93.field_0._0_4_ =
                                 (float)((uint)bVar57 * auVar78._0_4_ |
                                        (uint)!bVar57 * auVar81._0_4_);
                            bVar57 = (bool)((byte)(uVar50 >> 1) & 1);
                            vVar93.field_0._4_4_ =
                                 (float)((uint)bVar57 * auVar78._4_4_ |
                                        (uint)!bVar57 * auVar81._4_4_);
                            bVar57 = (bool)((byte)(uVar50 >> 2) & 1);
                            vVar93.field_0._8_4_ =
                                 (float)((uint)bVar57 * auVar78._8_4_ |
                                        (uint)!bVar57 * auVar81._8_4_);
                            bVar57 = (bool)((byte)(uVar50 >> 3) & 1);
                            vVar93.field_0._12_4_ =
                                 (float)((uint)bVar57 * auVar78._12_4_ |
                                        (uint)!bVar57 * auVar81._12_4_);
                            auVar179._0_4_ = fVar103 * vVar93.field_0._0_4_;
                            auVar179._4_4_ = fVar107 * vVar93.field_0._4_4_;
                            auVar179._8_4_ = fVar108 * vVar93.field_0._8_4_;
                            auVar179._12_4_ = fVar109 * vVar93.field_0._12_4_;
                            auVar67 = vfmadd213ps_fma(auVar95,(undefined1  [16])vVar92.field_0,
                                                      auVar179);
                            auVar67 = vfmadd213ps_fma(auVar94,(undefined1  [16])vVar91.field_0,
                                                      auVar67);
                            auVar163._0_4_ = auVar67._0_4_ + auVar67._0_4_;
                            auVar163._4_4_ = auVar67._4_4_ + auVar67._4_4_;
                            auVar163._8_4_ = auVar67._8_4_ + auVar67._8_4_;
                            auVar163._12_4_ = auVar67._12_4_ + auVar67._12_4_;
                            auVar169._0_4_ = auVar70._0_4_ * vVar93.field_0._0_4_;
                            auVar169._4_4_ = auVar70._4_4_ * vVar93.field_0._4_4_;
                            auVar169._8_4_ = auVar70._8_4_ * vVar93.field_0._8_4_;
                            auVar169._12_4_ = auVar70._12_4_ * vVar93.field_0._12_4_;
                            auVar67 = vfmadd213ps_fma(auVar69,(undefined1  [16])vVar92.field_0,
                                                      auVar169);
                            auVar95 = vfmadd213ps_fma(auVar68,(undefined1  [16])vVar91.field_0,
                                                      auVar67);
                            auVar67 = vrcp14ps_avx512vl(auVar163);
                            auVar68 = vxorps_avx512vl(auVar163,auVar74);
                            auVar94 = vfnmadd213ps_avx512vl(auVar67,auVar163,auVar66);
                            auVar94 = vfmadd132ps_fma(auVar94,auVar67,auVar67);
                            auVar67 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar128._0_4_ = auVar94._0_4_ * (auVar95._0_4_ + auVar95._0_4_);
                            auVar128._4_4_ = auVar94._4_4_ * (auVar95._4_4_ + auVar95._4_4_);
                            auVar128._8_4_ = auVar94._8_4_ * (auVar95._8_4_ + auVar95._8_4_);
                            auVar128._12_4_ = auVar94._12_4_ * (auVar95._12_4_ + auVar95._12_4_);
                            uVar10 = vcmpps_avx512vl(auVar128,auVar67,2);
                            uVar12 = vcmpps_avx512vl(auVar128,*(undefined1 (*) [16])(ray + 0x30),0xd
                                                    );
                            uVar13 = vcmpps_avx512vl(auVar163,auVar68,4);
                            bVar45 = bVar45 & (byte)uVar10 & (byte)uVar12 & (byte)uVar13;
                            if (bVar45 != 0) {
                              uVar46 = pGVar4->mask;
                              auVar150._4_4_ = uVar46;
                              auVar150._0_4_ = uVar46;
                              auVar150._8_4_ = uVar46;
                              auVar150._12_4_ = uVar46;
                              uVar10 = vptestmd_avx512vl(auVar150,*(undefined1 (*) [16])(ray + 0x90)
                                                        );
                              bVar45 = bVar45 & (byte)uVar10 & 0xf;
                              uVar58 = (ulong)bVar45;
                              if (bVar45 != 0) {
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  uVar59 = vcmpps_avx512vl(auVar87,auVar206._0_16_,5);
                                  auVar94 = vrcp14ps_avx512vl(auVar89);
                                  auVar95 = vfnmadd213ps_avx512vl(auVar89,auVar94,auVar66);
                                  auVar94 = vfmadd132ps_avx512vl(auVar95,auVar94,auVar94);
                                  fVar109 = (float)((uint)((byte)uVar59 & 1) * auVar94._0_4_);
                                  fVar108 = (float)((uint)((byte)(uVar59 >> 1) & 1) * auVar94._4_4_)
                                  ;
                                  fVar107 = (float)((uint)((byte)(uVar59 >> 2) & 1) * auVar94._8_4_)
                                  ;
                                  fVar103 = (float)((uint)((byte)(uVar59 >> 3) & 1) * auVar94._12_4_
                                                   );
                                  auVar106._0_4_ = fVar109 * auVar64._0_4_;
                                  auVar106._4_4_ = fVar108 * auVar64._4_4_;
                                  auVar106._8_4_ = fVar107 * auVar64._8_4_;
                                  auVar106._12_4_ = fVar103 * auVar64._12_4_;
                                  auVar64 = vminps_avx512vl(auVar106,auVar66);
                                  auVar142._0_4_ = fVar109 * auVar65._0_4_;
                                  auVar142._4_4_ = fVar108 * auVar65._4_4_;
                                  auVar142._8_4_ = fVar107 * auVar65._8_4_;
                                  auVar142._12_4_ = fVar103 * auVar65._12_4_;
                                  vminps_avx512vl(auVar142,auVar66);
                                  vpbroadcastd_avx512vl();
                                  vpbroadcastd_avx512vl();
                                  p0.field_0.field_0.x.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar91.field_0;
                                  p0.field_0.field_0.y.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar92.field_0;
                                  p0.field_0.field_0.z.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar93.field_0;
                                  vpcmpeqd_avx2(ZEXT1632(auVar64),ZEXT1632(auVar64));
                                  uVar46 = context->user->instPrimID[0];
                                  auVar66 = vblendmps_avx512vl(auVar67,auVar128);
                                  bVar57 = (bool)(bVar45 >> 1 & 1);
                                  bVar7 = (bool)(bVar45 >> 2 & 1);
                                  *(uint *)(ray + 0x80) =
                                       (uint)(bVar45 & 1) * auVar66._0_4_ |
                                       !(bool)(bVar45 & 1) * uVar46;
                                  *(uint *)(ray + 0x84) =
                                       (uint)bVar57 * auVar66._4_4_ | !bVar57 * uVar46;
                                  *(uint *)(ray + 0x88) =
                                       (uint)bVar7 * auVar66._8_4_ | !bVar7 * uVar46;
                                  *(uint *)(ray + 0x8c) =
                                       (uint)(bVar45 >> 3) * auVar66._12_4_ |
                                       !(bool)(bVar45 >> 3) * uVar46;
                                  itime.field_0 =
                                       (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpmovm2d_avx512vl((ulong)bVar45);
                                  p1.field_0._0_4_ = SUB84(&itime,0);
                                  p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                                  p1.field_0._8_4_ = SUB84(pGVar4->userPtr,0);
                                  p1.field_0._12_4_ = (undefined4)((ulong)pGVar4->userPtr >> 0x20);
                                  p1.field_0._16_4_ = SUB84(context->user,0);
                                  p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                  p1.field_0._32_4_ = SUB84(&p0,0);
                                  p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                  p1.field_0._40_4_ = 4;
                                  p1.field_0._0_8_ = &itime;
                                  p1.field_0._32_8_ = &p0;
                                  p1.field_0._24_8_ = ray;
                                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar203 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                    auVar204 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                    auVar210 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar209 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar208 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar207 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                    auVar206 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar205 = ZEXT1664(auVar66);
                                  }
                                  uVar58 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                             (undefined1  [16])itime.field_0);
                                  uVar58 = uVar58 & 0xf;
                                  if ((char)uVar58 != '\0') {
                                    p_Var6 = context->args->filter;
                                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar203 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                      auVar204 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar210 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar209 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar208 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar207 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                      auVar206 = ZEXT1664(auVar66);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar205 = ZEXT1664(auVar66);
                                    }
                                    uVar58 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                               (undefined1  [16])itime.field_0);
                                    uVar58 = uVar58 & 0xf;
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    bVar57 = (bool)((byte)uVar58 & 1);
                                    auVar99._0_4_ =
                                         (uint)bVar57 * auVar66._0_4_ |
                                         (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x80);
                                    bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
                                    auVar99._4_4_ =
                                         (uint)bVar57 * auVar66._4_4_ |
                                         (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x84);
                                    bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
                                    auVar99._8_4_ =
                                         (uint)bVar57 * auVar66._8_4_ |
                                         (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x88);
                                    bVar57 = SUB81(uVar58 >> 3,0);
                                    auVar99._12_4_ =
                                         (uint)bVar57 * auVar66._12_4_ |
                                         (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                    *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar99;
                                  }
                                  bVar57 = (bool)((byte)uVar58 & 1);
                                  auVar101._0_4_ =
                                       (uint)bVar57 * *(int *)pRVar1 | (uint)!bVar57 * auVar67._0_4_
                                  ;
                                  bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
                                  auVar101._4_4_ =
                                       (uint)bVar57 * *(int *)(ray + 0x84) |
                                       (uint)!bVar57 * auVar67._4_4_;
                                  bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
                                  auVar101._8_4_ =
                                       (uint)bVar57 * *(int *)(ray + 0x88) |
                                       (uint)!bVar57 * auVar67._8_4_;
                                  bVar57 = SUB81(uVar58 >> 3,0);
                                  auVar101._12_4_ =
                                       (uint)bVar57 * *(int *)(ray + 0x8c) |
                                       (uint)!bVar57 * auVar67._12_4_;
                                  *(undefined1 (*) [16])pRVar1 = auVar101;
                                }
                                uVar59 = (ulong)(((byte)uVar58 ^ 0xf) & bVar47);
                              }
                            }
                          }
                          bVar47 = (byte)uVar59;
                          if (bVar47 == 0) {
                            bVar57 = false;
                            auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            auVar66 = *(undefined1 (*) [16])ray;
                            auVar64 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar65 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar67 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar94 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar95 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar68 = vsubps_avx(local_35f8,auVar66);
                            auVar70 = vsubps_avx(local_3608,auVar64);
                            auVar69 = vsubps_avx(local_3618,auVar65);
                            auVar63 = vsubps_avx(auVar63,auVar66);
                            auVar61 = vsubps_avx(auVar61,auVar64);
                            auVar62 = vsubps_avx512vl(auVar62,auVar65);
                            auVar71 = vsubps_avx512vl(auVar71,auVar66);
                            auVar64 = vsubps_avx512vl(auVar72,auVar64);
                            auVar65 = vsubps_avx512vl(auVar73,auVar65);
                            auVar72 = vsubps_avx512vl(auVar71,auVar68);
                            auVar73 = vsubps_avx512vl(auVar64,auVar70);
                            auVar89 = vsubps_avx512vl(auVar65,auVar69);
                            auVar87 = vsubps_avx512vl(auVar68,auVar63);
                            auVar88 = vsubps_avx512vl(auVar70,auVar61);
                            auVar74 = vsubps_avx512vl(auVar69,auVar62);
                            auVar75 = vsubps_avx512vl(auVar63,auVar71);
                            auVar76 = vsubps_avx512vl(auVar61,auVar64);
                            auVar77 = vsubps_avx512vl(auVar62,auVar65);
                            auVar66 = vaddps_avx512vl(auVar71,auVar68);
                            auVar78 = vaddps_avx512vl(auVar64,auVar70);
                            auVar79 = vaddps_avx512vl(auVar65,auVar69);
                            auVar80 = vmulps_avx512vl(auVar78,auVar89);
                            auVar80 = vfmsub231ps_avx512vl(auVar80,auVar73,auVar79);
                            auVar79 = vmulps_avx512vl(auVar79,auVar72);
                            auVar79 = vfmsub231ps_avx512vl(auVar79,auVar89,auVar66);
                            auVar129._0_4_ = auVar73._0_4_ * auVar66._0_4_;
                            auVar129._4_4_ = auVar73._4_4_ * auVar66._4_4_;
                            auVar129._8_4_ = auVar73._8_4_ * auVar66._8_4_;
                            auVar129._12_4_ = auVar73._12_4_ * auVar66._12_4_;
                            auVar66 = vfmsub231ps_fma(auVar129,auVar72,auVar78);
                            fVar103 = auVar95._0_4_;
                            auVar130._0_4_ = fVar103 * auVar66._0_4_;
                            fVar107 = auVar95._4_4_;
                            auVar130._4_4_ = fVar107 * auVar66._4_4_;
                            fVar108 = auVar95._8_4_;
                            auVar130._8_4_ = fVar108 * auVar66._8_4_;
                            fVar109 = auVar95._12_4_;
                            auVar130._12_4_ = fVar109 * auVar66._12_4_;
                            auVar66 = vfmadd231ps_avx512vl(auVar130,auVar94,auVar79);
                            auVar66 = vfmadd231ps_avx512vl(auVar66,auVar67,auVar80);
                            auVar140._0_4_ = auVar63._0_4_ + auVar68._0_4_;
                            auVar140._4_4_ = auVar63._4_4_ + auVar68._4_4_;
                            auVar140._8_4_ = auVar63._8_4_ + auVar68._8_4_;
                            auVar140._12_4_ = auVar63._12_4_ + auVar68._12_4_;
                            auVar78 = vaddps_avx512vl(auVar70,auVar61);
                            auVar79 = vaddps_avx512vl(auVar69,auVar62);
                            auVar80 = vmulps_avx512vl(auVar78,auVar74);
                            auVar80 = vfmsub231ps_avx512vl(auVar80,auVar88,auVar79);
                            auVar79 = vmulps_avx512vl(auVar79,auVar87);
                            auVar79 = vfmsub231ps_avx512vl(auVar79,auVar74,auVar140);
                            auVar81 = vmulps_avx512vl(auVar140,auVar88);
                            auVar78 = vfmsub231ps_avx512vl(auVar81,auVar87,auVar78);
                            auVar141._0_4_ = fVar103 * auVar78._0_4_;
                            auVar141._4_4_ = fVar107 * auVar78._4_4_;
                            auVar141._8_4_ = fVar108 * auVar78._8_4_;
                            auVar141._12_4_ = fVar109 * auVar78._12_4_;
                            auVar78 = vfmadd231ps_avx512vl(auVar141,auVar94,auVar79);
                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar203 = ZEXT1664(auVar79);
                            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar67,auVar80);
                            auVar80 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                            auVar204 = ZEXT1664(auVar80);
                            auVar63 = vaddps_avx512vl(auVar63,auVar71);
                            auVar61 = vaddps_avx512vl(auVar61,auVar64);
                            auVar62 = vaddps_avx512vl(auVar62,auVar65);
                            auVar64 = vmulps_avx512vl(auVar61,auVar77);
                            auVar64 = vfmsub231ps_avx512vl(auVar64,auVar76,auVar62);
                            auVar62 = vmulps_avx512vl(auVar62,auVar75);
                            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar77,auVar63);
                            auVar186._0_4_ = auVar63._0_4_ * auVar76._0_4_;
                            auVar186._4_4_ = auVar63._4_4_ * auVar76._4_4_;
                            auVar186._8_4_ = auVar63._8_4_ * auVar76._8_4_;
                            auVar186._12_4_ = auVar63._12_4_ * auVar76._12_4_;
                            auVar61 = vfmsub231ps_fma(auVar186,auVar75,auVar61);
                            auVar61 = vmulps_avx512vl(auVar61,auVar95);
                            auVar61 = vfmadd231ps_avx512vl(auVar61,auVar94,auVar62);
                            auVar61 = vfmadd231ps_avx512vl(auVar61,auVar67,auVar64);
                            auVar187._0_4_ = auVar66._0_4_ + auVar78._0_4_;
                            auVar187._4_4_ = auVar66._4_4_ + auVar78._4_4_;
                            auVar187._8_4_ = auVar66._8_4_ + auVar78._8_4_;
                            auVar187._12_4_ = auVar66._12_4_ + auVar78._12_4_;
                            auVar62 = vaddps_avx512vl(auVar61,auVar187);
                            auVar71 = auVar205._0_16_;
                            auVar63 = vandps_avx512vl(auVar62,auVar71);
                            auVar64 = vmulps_avx512vl(auVar63,auVar80);
                            auVar65 = vminps_avx512vl(auVar66,auVar78);
                            auVar65 = vminps_avx512vl(auVar65,auVar61);
                            auVar95 = vxorps_avx512vl(auVar64,auVar79);
                            uVar10 = vcmpps_avx512vl(auVar65,auVar95,5);
                            auVar65 = vmaxps_avx512vl(auVar66,auVar78);
                            auVar61 = vmaxps_avx512vl(auVar65,auVar61);
                            uVar12 = vcmpps_avx512vl(auVar61,auVar64,2);
                            bVar45 = ((byte)uVar10 | (byte)uVar12) & 0xf & bVar47;
                            if (bVar45 == 0) {
LAB_008206c6:
                              auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              auVar61 = vmulps_avx512vl(auVar88,auVar89);
                              auVar64 = vmulps_avx512vl(auVar72,auVar74);
                              auVar65 = vmulps_avx512vl(auVar87,auVar73);
                              auVar95 = vmulps_avx512vl(auVar76,auVar74);
                              auVar79 = vmulps_avx512vl(auVar87,auVar77);
                              auVar80 = vmulps_avx512vl(auVar75,auVar88);
                              auVar73 = vfmsub213ps_avx512vl(auVar73,auVar74,auVar61);
                              auVar89 = vfmsub213ps_avx512vl(auVar89,auVar87,auVar64);
                              auVar72 = vfmsub213ps_avx512vl(auVar72,auVar88,auVar65);
                              auVar88 = vfmsub213ps_avx512vl(auVar77,auVar88,auVar95);
                              auVar74 = vfmsub213ps_avx512vl(auVar75,auVar74,auVar79);
                              auVar87 = vfmsub213ps_avx512vl(auVar76,auVar87,auVar80);
                              auVar61 = vandps_avx512vl(auVar61,auVar71);
                              auVar95 = vandps_avx512vl(auVar95,auVar71);
                              uVar58 = vcmpps_avx512vl(auVar61,auVar95,1);
                              auVar61 = vandps_avx512vl(auVar64,auVar71);
                              auVar64 = vandps_avx512vl(auVar79,auVar71);
                              uVar51 = vcmpps_avx512vl(auVar61,auVar64,1);
                              auVar61 = vandps_avx512vl(auVar65,auVar71);
                              auVar64 = vandps_avx512vl(auVar80,auVar71);
                              auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar203 = ZEXT1664(auVar95);
                              uVar50 = vcmpps_avx512vl(auVar61,auVar64,1);
                              bVar57 = (bool)((byte)uVar58 & 1);
                              vVar96.field_0._0_4_ =
                                   (uint)bVar57 * auVar73._0_4_ | (uint)!bVar57 * auVar88._0_4_;
                              bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
                              vVar96.field_0._4_4_ =
                                   (uint)bVar57 * auVar73._4_4_ | (uint)!bVar57 * auVar88._4_4_;
                              bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
                              vVar96.field_0._8_4_ =
                                   (uint)bVar57 * auVar73._8_4_ | (uint)!bVar57 * auVar88._8_4_;
                              bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
                              vVar96.field_0._12_4_ =
                                   (uint)bVar57 * auVar73._12_4_ | (uint)!bVar57 * auVar88._12_4_;
                              bVar57 = (bool)((byte)uVar51 & 1);
                              vVar97.field_0._0_4_ =
                                   (uint)bVar57 * auVar89._0_4_ | (uint)!bVar57 * auVar74._0_4_;
                              bVar57 = (bool)((byte)(uVar51 >> 1) & 1);
                              vVar97.field_0._4_4_ =
                                   (uint)bVar57 * auVar89._4_4_ | (uint)!bVar57 * auVar74._4_4_;
                              bVar57 = (bool)((byte)(uVar51 >> 2) & 1);
                              vVar97.field_0._8_4_ =
                                   (uint)bVar57 * auVar89._8_4_ | (uint)!bVar57 * auVar74._8_4_;
                              bVar57 = (bool)((byte)(uVar51 >> 3) & 1);
                              vVar97.field_0._12_4_ =
                                   (uint)bVar57 * auVar89._12_4_ | (uint)!bVar57 * auVar74._12_4_;
                              bVar57 = (bool)((byte)uVar50 & 1);
                              vVar98.field_0._0_4_ =
                                   (float)((uint)bVar57 * auVar72._0_4_ |
                                          (uint)!bVar57 * auVar87._0_4_);
                              bVar57 = (bool)((byte)(uVar50 >> 1) & 1);
                              vVar98.field_0._4_4_ =
                                   (float)((uint)bVar57 * auVar72._4_4_ |
                                          (uint)!bVar57 * auVar87._4_4_);
                              bVar57 = (bool)((byte)(uVar50 >> 2) & 1);
                              vVar98.field_0._8_4_ =
                                   (float)((uint)bVar57 * auVar72._8_4_ |
                                          (uint)!bVar57 * auVar87._8_4_);
                              bVar57 = (bool)((byte)(uVar50 >> 3) & 1);
                              vVar98.field_0._12_4_ =
                                   (float)((uint)bVar57 * auVar72._12_4_ |
                                          (uint)!bVar57 * auVar87._12_4_);
                              auVar180._0_4_ = fVar103 * vVar98.field_0._0_4_;
                              auVar180._4_4_ = fVar107 * vVar98.field_0._4_4_;
                              auVar180._8_4_ = fVar108 * vVar98.field_0._8_4_;
                              auVar180._12_4_ = fVar109 * vVar98.field_0._12_4_;
                              auVar61 = vfmadd213ps_fma(auVar94,(undefined1  [16])vVar97.field_0,
                                                        auVar180);
                              auVar61 = vfmadd213ps_fma(auVar67,(undefined1  [16])vVar96.field_0,
                                                        auVar61);
                              auVar164._0_4_ = auVar61._0_4_ + auVar61._0_4_;
                              auVar164._4_4_ = auVar61._4_4_ + auVar61._4_4_;
                              auVar164._8_4_ = auVar61._8_4_ + auVar61._8_4_;
                              auVar164._12_4_ = auVar61._12_4_ + auVar61._12_4_;
                              auVar170._0_4_ = auVar69._0_4_ * vVar98.field_0._0_4_;
                              auVar170._4_4_ = auVar69._4_4_ * vVar98.field_0._4_4_;
                              auVar170._8_4_ = auVar69._8_4_ * vVar98.field_0._8_4_;
                              auVar170._12_4_ = auVar69._12_4_ * vVar98.field_0._12_4_;
                              auVar61 = vfmadd213ps_fma(auVar70,(undefined1  [16])vVar97.field_0,
                                                        auVar170);
                              auVar65 = vfmadd213ps_fma(auVar68,(undefined1  [16])vVar96.field_0,
                                                        auVar61);
                              auVar61 = vrcp14ps_avx512vl(auVar164);
                              auVar67 = vxorps_avx512vl(auVar164,auVar95);
                              auVar94 = auVar207._0_16_;
                              auVar64 = vfnmadd213ps_avx512vl(auVar61,auVar164,auVar94);
                              auVar64 = vfmadd132ps_fma(auVar64,auVar61,auVar61);
                              auVar61 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar151._0_4_ = auVar64._0_4_ * (auVar65._0_4_ + auVar65._0_4_);
                              auVar151._4_4_ = auVar64._4_4_ * (auVar65._4_4_ + auVar65._4_4_);
                              auVar151._8_4_ = auVar64._8_4_ * (auVar65._8_4_ + auVar65._8_4_);
                              auVar151._12_4_ = auVar64._12_4_ * (auVar65._12_4_ + auVar65._12_4_);
                              uVar10 = vcmpps_avx512vl(auVar151,auVar61,2);
                              uVar12 = vcmpps_avx512vl(auVar151,*(undefined1 (*) [16])(ray + 0x30),
                                                       0xd);
                              uVar13 = vcmpps_avx512vl(auVar164,auVar67,4);
                              bVar45 = bVar45 & (byte)uVar10 & (byte)uVar12 & (byte)uVar13;
                              if (bVar45 == 0) goto LAB_008206c6;
                              pGVar4 = (context->scene->geometries).items
                                       [*(uint *)(lVar52 + 0x40 + uVar56 * 4)].ptr;
                              uVar46 = pGVar4->mask;
                              auVar158._4_4_ = uVar46;
                              auVar158._0_4_ = uVar46;
                              auVar158._8_4_ = uVar46;
                              auVar158._12_4_ = uVar46;
                              uVar10 = vptestmd_avx512vl(auVar158,*(undefined1 (*) [16])(ray + 0x90)
                                                        );
                              bVar45 = bVar45 & (byte)uVar10 & 0xf;
                              if (bVar45 == 0) goto LAB_008206c6;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                                auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                              }
                              else {
                                uVar59 = vcmpps_avx512vl(auVar63,auVar206._0_16_,5);
                                auVar63 = vrcp14ps_avx512vl(auVar62);
                                auVar62 = vfnmadd213ps_avx512vl(auVar62,auVar63,auVar94);
                                auVar62 = vfmadd132ps_avx512vl(auVar62,auVar63,auVar63);
                                fVar109 = (float)((uint)((byte)uVar59 & 1) * auVar62._0_4_);
                                fVar108 = (float)((uint)((byte)(uVar59 >> 1) & 1) * auVar62._4_4_);
                                fVar107 = (float)((uint)((byte)(uVar59 >> 2) & 1) * auVar62._8_4_);
                                fVar103 = (float)((uint)((byte)(uVar59 >> 3) & 1) * auVar62._12_4_);
                                auVar131._0_4_ = fVar109 * auVar66._0_4_;
                                auVar131._4_4_ = fVar108 * auVar66._4_4_;
                                auVar131._8_4_ = fVar107 * auVar66._8_4_;
                                auVar131._12_4_ = fVar103 * auVar66._12_4_;
                                auVar66 = vminps_avx512vl(auVar131,auVar94);
                                auVar143._0_4_ = fVar109 * auVar78._0_4_;
                                auVar143._4_4_ = fVar108 * auVar78._4_4_;
                                auVar143._8_4_ = fVar107 * auVar78._8_4_;
                                auVar143._12_4_ = fVar103 * auVar78._12_4_;
                                auVar62 = vminps_avx512vl(auVar143,auVar94);
                                vsubps_avx512vl(auVar94,auVar66);
                                vsubps_avx512vl(auVar94,auVar62);
                                vpbroadcastd_avx512vl();
                                vpbroadcastd_avx512vl();
                                p0.field_0.field_0.x.field_0 =
                                     (vfloat_impl<4>)(vfloat_impl<4>)vVar96.field_0;
                                p0.field_0.field_0.y.field_0 =
                                     (vfloat_impl<4>)(vfloat_impl<4>)vVar97.field_0;
                                p0.field_0.field_0.z.field_0 =
                                     (vfloat_impl<4>)(vfloat_impl<4>)vVar98.field_0;
                                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar97.field_0),
                                              ZEXT1632((undefined1  [16])vVar97.field_0));
                                uVar46 = context->user->instPrimID[0];
                                auVar66 = vblendmps_avx512vl(auVar61,auVar151);
                                bVar57 = (bool)(bVar45 >> 1 & 1);
                                bVar7 = (bool)(bVar45 >> 2 & 1);
                                *(uint *)(ray + 0x80) =
                                     (uint)(bVar45 & 1) * auVar66._0_4_ |
                                     !(bool)(bVar45 & 1) * uVar46;
                                *(uint *)(ray + 0x84) =
                                     (uint)bVar57 * auVar66._4_4_ | !bVar57 * uVar46;
                                *(uint *)(ray + 0x88) =
                                     (uint)bVar7 * auVar66._8_4_ | !bVar7 * uVar46;
                                *(uint *)(ray + 0x8c) =
                                     (uint)(bVar45 >> 3) * auVar66._12_4_ |
                                     !(bool)(bVar45 >> 3) * uVar46;
                                itime.field_0 =
                                     (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vpmovm2d_avx512vl((ulong)bVar45);
                                p1.field_0._0_4_ = SUB84(&itime,0);
                                p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                                p1.field_0._8_4_ = SUB84(pGVar4->userPtr,0);
                                p1.field_0._12_4_ = (undefined4)((ulong)pGVar4->userPtr >> 0x20);
                                p1.field_0._16_4_ = SUB84(context->user,0);
                                p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                p1.field_0._32_4_ = SUB84(&p0,0);
                                p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                p1.field_0._40_4_ = 4;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._24_8_ = ray;
                                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar203 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                  auVar204 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                  auVar210 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar209 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar208 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar207 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                  auVar206 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar205 = ZEXT1664(auVar66);
                                }
                                uVar59 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                uVar59 = uVar59 & 0xf;
                                if ((char)uVar59 == '\0') {
                                  auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                                CONCAT48(0x3f800003,
                                                                         0x3f8000033f800003)));
                                }
                                else {
                                  p_Var6 = context->args->filter;
                                  auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                                CONCAT48(0x3f800003,
                                                                         0x3f8000033f800003)));
                                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar203 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                    auVar204 = ZEXT1664(auVar66);
                                    auVar196 = ZEXT1664(CONCAT412(0x3f800003,
                                                                  CONCAT48(0x3f800003,
                                                                           0x3f8000033f800003)));
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                    auVar210 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar209 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar208 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar207 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                    auVar206 = ZEXT1664(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar205 = ZEXT1664(auVar66);
                                  }
                                  uVar59 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                             (undefined1  [16])itime.field_0);
                                  uVar59 = uVar59 & 0xf;
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar57 = (bool)((byte)uVar59 & 1);
                                  auVar100._0_4_ =
                                       (uint)bVar57 * auVar66._0_4_ |
                                       (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x80);
                                  bVar57 = (bool)((byte)(uVar59 >> 1) & 1);
                                  auVar100._4_4_ =
                                       (uint)bVar57 * auVar66._4_4_ |
                                       (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x84);
                                  bVar57 = (bool)((byte)(uVar59 >> 2) & 1);
                                  auVar100._8_4_ =
                                       (uint)bVar57 * auVar66._8_4_ |
                                       (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x88);
                                  bVar57 = SUB81(uVar59 >> 3,0);
                                  auVar100._12_4_ =
                                       (uint)bVar57 * auVar66._12_4_ |
                                       (uint)!bVar57 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar100;
                                }
                                bVar45 = (byte)uVar59;
                                auVar102._0_4_ =
                                     (uint)(bVar45 & 1) * *(int *)pRVar1 |
                                     (uint)!(bool)(bVar45 & 1) * auVar61._0_4_;
                                bVar57 = (bool)((byte)(uVar59 >> 1) & 1);
                                auVar102._4_4_ =
                                     (uint)bVar57 * *(int *)(ray + 0x84) |
                                     (uint)!bVar57 * auVar61._4_4_;
                                bVar57 = (bool)((byte)(uVar59 >> 2) & 1);
                                auVar102._8_4_ =
                                     (uint)bVar57 * *(int *)(ray + 0x88) |
                                     (uint)!bVar57 * auVar61._8_4_;
                                bVar57 = SUB81(uVar59 >> 3,0);
                                auVar102._12_4_ =
                                     (uint)bVar57 * *(int *)(ray + 0x8c) |
                                     (uint)!bVar57 * auVar61._12_4_;
                                *(undefined1 (*) [16])pRVar1 = auVar102;
                              }
                              uVar59 = (ulong)((bVar45 ^ 0xf) & bVar47);
                            }
                            bVar57 = (char)uVar59 != '\0';
                          }
                          bVar47 = (byte)uVar59;
                          if ((!bVar57) || (bVar57 = 2 < uVar56, uVar56 = uVar56 + 1, bVar57))
                          break;
                        }
                        bVar39 = bVar39 & bVar47;
                      } while ((bVar39 != 0) && (uVar42 = uVar42 + 1, uVar42 < uVar60 - 8));
                      bVar39 = bVar39 ^ 0xf;
                    }
                    bVar39 = (byte)uVar44 | bVar39;
                    uVar44 = (ushort)bVar39;
                    if (bVar39 == 0xf) goto LAB_00820d4e;
                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    tray.tfar.field_0.i[0] =
                         (uint)(bVar39 & 1) * auVar61._0_4_ |
                         (uint)!(bool)(bVar39 & 1) * tray.tfar.field_0.i[0];
                    bVar57 = (bool)(bVar39 >> 1 & 1);
                    tray.tfar.field_0.i[1] =
                         (uint)bVar57 * auVar61._4_4_ | (uint)!bVar57 * tray.tfar.field_0.i[1];
                    bVar57 = (bool)(bVar39 >> 2 & 1);
                    tray.tfar.field_0.i[2] =
                         (uint)bVar57 * auVar61._8_4_ | (uint)!bVar57 * tray.tfar.field_0.i[2];
                    bVar57 = (bool)(bVar39 >> 3 & 1);
                    tray.tfar.field_0.i[3] =
                         (uint)bVar57 * auVar61._12_4_ | (uint)!bVar57 * tray.tfar.field_0.i[3];
                    iVar41 = 0;
                    break;
                  }
                  goto LAB_00820d83;
                }
                uVar10 = vcmpps_avx512vl(auVar202._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                uVar42 = root.ptr & 0xfffffffffffffff0;
                auVar202 = ZEXT1664(auVar209._0_16_);
                uVar60 = 0;
                root.ptr = 8;
                do {
                  sVar3 = *(size_t *)(uVar42 + uVar60 * 8);
                  if (sVar3 != 8) {
                    uVar55 = *(undefined4 *)(uVar42 + 0x100 + uVar60 * 4);
                    auVar111._4_4_ = uVar55;
                    auVar111._0_4_ = uVar55;
                    auVar111._8_4_ = uVar55;
                    auVar111._12_4_ = uVar55;
                    auVar61 = *(undefined1 (*) [16])(ray + 0x70);
                    uVar55 = *(undefined4 *)(uVar42 + 0x40 + uVar60 * 4);
                    auVar15._4_4_ = uVar55;
                    auVar15._0_4_ = uVar55;
                    auVar15._8_4_ = uVar55;
                    auVar15._12_4_ = uVar55;
                    auVar66 = vfmadd213ps_avx512vl(auVar111,auVar61,auVar15);
                    uVar55 = *(undefined4 *)(uVar42 + 0x140 + uVar60 * 4);
                    auVar117._4_4_ = uVar55;
                    auVar117._0_4_ = uVar55;
                    auVar117._8_4_ = uVar55;
                    auVar117._12_4_ = uVar55;
                    uVar55 = *(undefined4 *)(uVar42 + 0x80 + uVar60 * 4);
                    auVar16._4_4_ = uVar55;
                    auVar16._0_4_ = uVar55;
                    auVar16._8_4_ = uVar55;
                    auVar16._12_4_ = uVar55;
                    auVar62 = vfmadd213ps_avx512vl(auVar117,auVar61,auVar16);
                    uVar55 = *(undefined4 *)(uVar42 + 0x180 + uVar60 * 4);
                    auVar126._4_4_ = uVar55;
                    auVar126._0_4_ = uVar55;
                    auVar126._8_4_ = uVar55;
                    auVar126._12_4_ = uVar55;
                    uVar55 = *(undefined4 *)(uVar42 + 0xc0 + uVar60 * 4);
                    auVar17._4_4_ = uVar55;
                    auVar17._0_4_ = uVar55;
                    auVar17._8_4_ = uVar55;
                    auVar17._12_4_ = uVar55;
                    auVar63 = vfmadd213ps_avx512vl(auVar126,auVar61,auVar17);
                    uVar55 = *(undefined4 *)(uVar42 + 0x120 + uVar60 * 4);
                    auVar136._4_4_ = uVar55;
                    auVar136._0_4_ = uVar55;
                    auVar136._8_4_ = uVar55;
                    auVar136._12_4_ = uVar55;
                    uVar55 = *(undefined4 *)(uVar42 + 0x60 + uVar60 * 4);
                    auVar18._4_4_ = uVar55;
                    auVar18._0_4_ = uVar55;
                    auVar18._8_4_ = uVar55;
                    auVar18._12_4_ = uVar55;
                    auVar64 = vfmadd213ps_avx512vl(auVar136,auVar61,auVar18);
                    uVar55 = *(undefined4 *)(uVar42 + 0x160 + uVar60 * 4);
                    auVar148._4_4_ = uVar55;
                    auVar148._0_4_ = uVar55;
                    auVar148._8_4_ = uVar55;
                    auVar148._12_4_ = uVar55;
                    uVar55 = *(undefined4 *)(uVar42 + 0xa0 + uVar60 * 4);
                    auVar19._4_4_ = uVar55;
                    auVar19._0_4_ = uVar55;
                    auVar19._8_4_ = uVar55;
                    auVar19._12_4_ = uVar55;
                    auVar65 = vfmadd213ps_avx512vl(auVar148,auVar61,auVar19);
                    uVar55 = *(undefined4 *)(uVar42 + 0x1a0 + uVar60 * 4);
                    auVar156._4_4_ = uVar55;
                    auVar156._0_4_ = uVar55;
                    auVar156._8_4_ = uVar55;
                    auVar156._12_4_ = uVar55;
                    uVar55 = *(undefined4 *)(uVar42 + 0xe0 + uVar60 * 4);
                    auVar20._4_4_ = uVar55;
                    auVar20._0_4_ = uVar55;
                    auVar20._8_4_ = uVar55;
                    auVar20._12_4_ = uVar55;
                    auVar67 = vfmadd213ps_avx512vl(auVar156,auVar61,auVar20);
                    auVar36._8_8_ = tray.org.field_0._8_8_;
                    auVar36._0_8_ = tray.org.field_0._0_8_;
                    auVar37._8_8_ = tray.org.field_0._24_8_;
                    auVar37._0_8_ = tray.org.field_0._16_8_;
                    auVar38._8_8_ = tray.org.field_0._40_8_;
                    auVar38._0_8_ = tray.org.field_0._32_8_;
                    auVar66 = vsubps_avx(auVar66,auVar36);
                    auVar185._0_4_ = tray.rdir.field_0._0_4_ * auVar66._0_4_;
                    auVar185._4_4_ = tray.rdir.field_0._4_4_ * auVar66._4_4_;
                    auVar185._8_4_ = tray.rdir.field_0._8_4_ * auVar66._8_4_;
                    auVar185._12_4_ = tray.rdir.field_0._12_4_ * auVar66._12_4_;
                    auVar66 = vsubps_avx(auVar62,auVar37);
                    auVar118._0_4_ = auVar66._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar118._4_4_ = auVar66._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar118._8_4_ = auVar66._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar118._12_4_ = auVar66._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar66 = vsubps_avx(auVar63,auVar38);
                    auVar127._0_4_ = tray.rdir.field_0._32_4_ * auVar66._0_4_;
                    auVar127._4_4_ = tray.rdir.field_0._36_4_ * auVar66._4_4_;
                    auVar127._8_4_ = tray.rdir.field_0._40_4_ * auVar66._8_4_;
                    auVar127._12_4_ = tray.rdir.field_0._44_4_ * auVar66._12_4_;
                    auVar66 = vsubps_avx(auVar64,auVar36);
                    auVar137._0_4_ = tray.rdir.field_0._0_4_ * auVar66._0_4_;
                    auVar137._4_4_ = tray.rdir.field_0._4_4_ * auVar66._4_4_;
                    auVar137._8_4_ = tray.rdir.field_0._8_4_ * auVar66._8_4_;
                    auVar137._12_4_ = tray.rdir.field_0._12_4_ * auVar66._12_4_;
                    auVar66 = vsubps_avx(auVar65,auVar37);
                    auVar149._0_4_ = auVar66._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar149._4_4_ = auVar66._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar149._8_4_ = auVar66._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar149._12_4_ = auVar66._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar66 = vsubps_avx(auVar67,auVar38);
                    auVar157._0_4_ = tray.rdir.field_0._32_4_ * auVar66._0_4_;
                    auVar157._4_4_ = tray.rdir.field_0._36_4_ * auVar66._4_4_;
                    auVar157._8_4_ = tray.rdir.field_0._40_4_ * auVar66._8_4_;
                    auVar157._12_4_ = tray.rdir.field_0._44_4_ * auVar66._12_4_;
                    auVar66 = vpminsd_avx(auVar185,auVar137);
                    auVar62 = vpminsd_avx(auVar118,auVar149);
                    auVar66 = vpmaxsd_avx(auVar66,auVar62);
                    auVar62 = vpminsd_avx(auVar127,auVar157);
                    auVar66 = vpmaxsd_avx(auVar66,auVar62);
                    auVar63 = vmulps_avx512vl(auVar66,auVar210._0_16_);
                    auVar66 = vpmaxsd_avx(auVar185,auVar137);
                    auVar62 = vpmaxsd_avx(auVar118,auVar149);
                    auVar62 = vpminsd_avx(auVar66,auVar62);
                    auVar66 = vpmaxsd_avx(auVar127,auVar157);
                    auVar66 = vpminsd_avx(auVar62,auVar66);
                    auVar119._0_4_ = auVar196._0_4_ * auVar66._0_4_;
                    auVar119._4_4_ = auVar196._4_4_ * auVar66._4_4_;
                    auVar119._8_4_ = auVar196._8_4_ * auVar66._8_4_;
                    auVar119._12_4_ = auVar196._12_4_ * auVar66._12_4_;
                    auVar66 = vpmaxsd_avx(auVar63,(undefined1  [16])tray.tnear.field_0);
                    auVar62 = vpminsd_avx(auVar119,(undefined1  [16])tray.tfar.field_0);
                    uVar12 = vcmpps_avx512vl(auVar66,auVar62,2);
                    bVar39 = (byte)uVar12;
                    if ((uVar46 & 7) == 6) {
                      uVar55 = *(undefined4 *)(uVar42 + 0x1e0 + uVar60 * 4);
                      auVar21._4_4_ = uVar55;
                      auVar21._0_4_ = uVar55;
                      auVar21._8_4_ = uVar55;
                      auVar21._12_4_ = uVar55;
                      uVar12 = vcmpps_avx512vl(auVar61,auVar21,1);
                      uVar55 = *(undefined4 *)(uVar42 + 0x1c0 + uVar60 * 4);
                      auVar22._4_4_ = uVar55;
                      auVar22._0_4_ = uVar55;
                      auVar22._8_4_ = uVar55;
                      auVar22._12_4_ = uVar55;
                      uVar13 = vcmpps_avx512vl(auVar61,auVar22,0xd);
                      bVar39 = (byte)uVar12 & (byte)uVar13 & bVar39;
                    }
                    bVar39 = bVar39 & (byte)uVar10;
                    if (bVar39 != 0) {
                      auVar66 = vblendmps_avx512vl(auVar209._0_16_,auVar63);
                      bVar57 = (bool)(bVar39 >> 1 & 1);
                      bVar7 = (bool)(bVar39 >> 2 & 1);
                      bVar8 = (bool)(bVar39 >> 3 & 1);
                      if (root.ptr != 8) {
                        pNVar53->ptr = root.ptr;
                        pNVar53 = pNVar53 + 1;
                        *paVar54 = auVar202._0_16_;
                        paVar54 = paVar54 + 1;
                      }
                      auVar202 = ZEXT1664(CONCAT412((uint)bVar8 * auVar66._12_4_ |
                                                    (uint)!bVar8 * auVar61._12_4_,
                                                    CONCAT48((uint)bVar7 * auVar66._8_4_ |
                                                             (uint)!bVar7 * auVar61._8_4_,
                                                             CONCAT44((uint)bVar57 * auVar66._4_4_ |
                                                                      (uint)!bVar57 * auVar61._4_4_,
                                                                      (uint)(bVar39 & 1) *
                                                                      auVar66._0_4_ |
                                                                      (uint)!(bool)(bVar39 & 1) *
                                                                      auVar61._0_4_))));
                      root.ptr = sVar3;
                    }
                  }
                } while ((sVar3 != 8) && (bVar57 = uVar60 < 7, uVar60 = uVar60 + 1, bVar57));
                iVar41 = 0;
                if (root.ptr == 8) {
LAB_0081faf0:
                  bVar57 = false;
                  iVar41 = 4;
                }
                else {
                  uVar10 = vcmpps_avx512vl((undefined1  [16])auVar202._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar57 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= uVar48) {
                    pNVar53->ptr = root.ptr;
                    pNVar53 = pNVar53 + 1;
                    *paVar54 = auVar202._0_16_;
                    paVar54 = paVar54 + 1;
                    goto LAB_0081faf0;
                  }
                }
              } while (bVar57);
            }
          }
        }
      } while (iVar41 != 3);
      bVar40 = (byte)uVar44 & bVar40;
      bVar57 = (bool)(bVar40 >> 1 & 1);
      bVar7 = (bool)(bVar40 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)(bVar40 & 1) * auVar208._0_4_ | (uint)!(bool)(bVar40 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar57 * auVar208._4_4_ | (uint)!bVar57 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar7 * auVar208._8_4_ | (uint)!bVar7 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar40 >> 3) * auVar208._12_4_ | (uint)!(bool)(bVar40 >> 3) * *(int *)(ray + 0x8c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }